

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::setChecked(QGroupBox *this,bool b)

{
  State state;
  byte in_SIL;
  QAccessibleStateChangeEvent *in_RDI;
  long in_FS_OFFSET;
  QGroupBoxPrivate *d;
  QAccessibleStateChangeEvent e;
  State st;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QAccessibleStateChangeEvent *pQVar1;
  QGroupBoxPrivate *in_stack_ffffffffffffffc0;
  QAccessibleStateChangeEvent local_38 [40];
  undefined1 *local_10;
  long local_8;
  undefined1 b_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = in_RDI;
  state = (State)d_func((QGroupBox *)0x5a38d3);
  b_00 = (undefined1)((ulong)pQVar1 >> 0x38);
  if (((*(bool *)((long)state + 0x279) & 1U) != 0) &&
     ((in_SIL & 1) != (*(bool *)((long)state + 0x27a) & 1U))) {
    QWidget::update((QWidget *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    *(byte *)((long)state + 0x27a) = in_SIL & 1;
    QGroupBoxPrivate::_q_setChildrenEnabled(in_stack_ffffffffffffffc0,(bool)b_00);
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessible::State::State((State *)0x5a3951);
    local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffffbf | 0x40);
    memset(local_38,0xaa,0x28);
    QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
              (in_RDI,(QObject *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),state
              );
    QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
    toggled((QGroupBox *)0x5a39ae,(bool)in_stack_ffffffffffffff9f);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent(local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::setChecked(bool b)
{
    Q_D(QGroupBox);
    if (d->checkable && b != d->checked) {
        update();
        d->checked = b;
        d->_q_setChildrenEnabled(b);
#if QT_CONFIG(accessibility)
        QAccessible::State st;
        st.checked = true;
        QAccessibleStateChangeEvent e(this, st);
        QAccessible::updateAccessibility(&e);
#endif
        emit toggled(b);
    }
}